

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::verifyTimestamp
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_29;
  string local_28;
  
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)((long)(this->m_stages).
                      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_stages).
                      super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"Timestamp increases steadily.",&local_29);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_28);
LAB_004c0573:
      std::__cxx11::string::~string((string *)&local_28);
      return __return_storage_ptr__;
    }
    uVar4 = 0;
    while (uVar3 != uVar4) {
      puVar1 = this->m_timestampValues + uVar4;
      uVar4 = uVar4 + 1;
      if (this->m_timestampValues[uVar3] < *puVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,
                   "Latter stage timestamp is smaller than the former stage timestamp.",&local_29);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_28);
        goto LAB_004c0573;
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus TimestampTestInstance::verifyTimestamp(void)
{
	for (deUint32 first = 0; first < m_stages.size(); first++)
	{
		for (deUint32 second = 0; second < first; second++)
		{
			if(m_timestampValues[first] < m_timestampValues[second])
			{
				return tcu::TestStatus::fail("Latter stage timestamp is smaller than the former stage timestamp.");
			}
		}
	}

	return tcu::TestStatus::pass("Timestamp increases steadily.");
}